

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int ffpktp(fitsfile *fptr,char *filename,int *status)

{
  char *__s;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  int keytype;
  char keyname [75];
  char newname [75];
  char card [81];
  char template [161];
  int local_1dc;
  char local_1d8 [8];
  undefined1 local_1d0;
  char local_188 [8];
  undefined1 local_180;
  char local_138 [40];
  char local_110 [55];
  char acStack_d9 [161];
  undefined1 local_38;
  
  if (0 < *status) {
    return *status;
  }
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    ffpmsg("ffpktp could not open the following template file:");
    ffpmsg(filename);
    *status = 0x68;
    iVar1 = 0x68;
  }
  else {
    __s = acStack_d9 + 1;
    pcVar2 = fgets(__s,0xa0,__stream);
    if (pcVar2 != (char *)0x0) {
      do {
        local_38 = 0;
        sVar3 = strlen(__s);
        __s[sVar3 - 1] = '\0';
        iVar1 = ffgthd(__s,local_138,&local_1dc,status);
        if (0 < iVar1) break;
        strncpy(local_1d8,local_138,8);
        local_1d0 = 0;
        switch(local_1dc) {
        case 0:
          ffucrd(fptr,local_1d8,local_138,status);
          break;
        case 1:
          ffprec(fptr,local_138,status);
          break;
        case -2:
          strncpy(local_188,local_110,8);
          local_180 = 0;
          ffmnam(fptr,local_1d8,local_188,status);
          break;
        case -1:
          ffdkey(fptr,local_1d8,status);
          break;
        default:
          goto switchD_001f2b1c_default;
        }
        pcVar2 = fgets(__s,0xa0,__stream);
      } while (pcVar2 != (char *)0x0);
    }
switchD_001f2b1c_default:
    fclose(__stream);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffpktp(fitsfile *fptr,       /* I - FITS file pointer       */
           const char *filename, /* I - name of template file   */
           int *status)          /* IO - error status           */
/*
  read keywords from template file and append to the FITS file
*/
{
    FILE *diskfile;
    char card[FLEN_CARD], template[161];
    char keyname[FLEN_KEYWORD], newname[FLEN_KEYWORD];
    int keytype;
    size_t slen;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    diskfile = fopen(filename,"r"); 
    if (!diskfile)          /* couldn't open file */
    {
            ffpmsg("ffpktp could not open the following template file:");
            ffpmsg(filename);
            return(*status = FILE_NOT_OPENED); 
    }

    while (fgets(template, 160, diskfile) )  /* get next template line */
    {
      template[160] = '\0';      /* make sure string is terminated */
      slen = strlen(template);   /* get string length */
      template[slen - 1] = '\0';  /* over write the 'newline' char */

      if (ffgthd(template, card, &keytype, status) > 0) /* parse template */
         break;

      strncpy(keyname, card, 8);
      keyname[8] = '\0';

      if (keytype == -2)            /* rename the card */
      {
         strncpy(newname, &card[40], 8);
         newname[8] = '\0';

         ffmnam(fptr, keyname, newname, status); 
      }
      else if (keytype == -1)      /* delete the card */
      {
         ffdkey(fptr, keyname, status);
      }
      else if (keytype == 0)       /* update the card */
      {
         ffucrd(fptr, keyname, card, status);
      }
      else if (keytype == 1)      /* append the card */
      {
         ffprec(fptr, card, status);
      }
      else    /* END card; stop here */
      {
         break; 
      }
    }

    fclose(diskfile);   /* close the template file */
    return(*status);
}